

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

pointer __thiscall
QList<std::pair<QTreeWidgetItem_*,_int>_>::data(QList<std::pair<QTreeWidgetItem_*,_int>_> *this)

{
  detach(this);
  return (this->d).ptr;
}

Assistant:

pointer data() { detach(); return d->data(); }